

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  size_type sVar2;
  size_type sVar3;
  iterator iVar4;
  ostream *poVar5;
  mapped_type *this_02;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  undefined8 uVar12;
  StringPiece proto_file_list;
  StringPiece framework_name;
  StringPiece proto_file;
  string local_d0;
  string local_b0;
  size_type local_90;
  string local_88;
  StringPiece local_68;
  char *local_58 [2];
  size_type local_48;
  StringPiece local_40;
  
  local_68.length_ = (size_type)local_68.ptr_;
  sVar2 = stringpiece_internal::StringPiece::find(line,':',0);
  local_48 = (size_type)(int)sVar2;
  if (local_48 != 0xffffffffffffffff) {
    iVar10 = 0;
    local_68 = stringpiece_internal::StringPiece::substr(line,0,local_48);
    local_90 = 0xffffffffffffffff;
    local_88._0_16_ =
         stringpiece_internal::StringPiece::substr
                   (line,(long)((sVar2 << 0x20) + 0x100000000) >> 0x20,0xffffffffffffffff);
    sVar2 = local_88._M_string_length;
    TrimWhitespace(&local_68);
    if (sVar2 != 0) {
      sVar2 = 0;
      do {
        sVar3 = stringpiece_internal::StringPiece::find((StringPiece *)&local_88,',',sVar2);
        iVar9 = (int)sVar3;
        if ((long)(int)sVar3 == local_90) {
          iVar9 = (int)local_88._M_string_length;
        }
        local_40 = stringpiece_internal::StringPiece::substr
                             ((StringPiece *)&local_88,sVar2,(long)(iVar9 - iVar10));
        TrimWhitespace(&local_40);
        if (local_40.length_ != 0) {
          this_00 = &this->map_->_M_t;
          stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_d0,&local_40);
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(this_00,&local_d0);
          paVar1 = &local_d0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((_Rb_tree_header *)iVar4._M_node != &(this->map_->_M_t)._M_impl.super__Rb_tree_header)
          {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: duplicate proto file reference, replacing framework entry for \'",
                       0x48);
            stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_d0,&local_40);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                                local_d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' with \'",8);
            stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_b0,&local_68);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' (was \'",8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,*(char **)(iVar4._M_node + 2),
                                (long)iVar4._M_node[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\').",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar1) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            std::ostream::flush();
          }
          sVar2 = stringpiece_internal::StringPiece::find(&local_40,' ',0);
          if (sVar2 != local_90) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                       ,0x66);
            stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_d0,&local_40);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                                local_d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar1) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            std::ostream::flush();
          }
          stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_d0,&local_68);
          this_01 = this->map_;
          stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_b0,&local_40);
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this_01,&local_b0);
          std::__cxx11::string::operator=((string *)this_02,(string *)&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
        }
        iVar10 = iVar9 + 1;
        sVar2 = (size_type)iVar10;
      } while (sVar2 < local_88._M_string_length);
    }
    goto LAB_0027630f;
  }
  local_68.ptr_ = (char *)local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Framework/proto file mapping line without colon sign: \'","");
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_88,line);
  pcVar11 = (char *)0xf;
  if ((char **)local_68.ptr_ != local_58) {
    pcVar11 = local_58[0];
  }
  if (pcVar11 < (char *)(local_68.length_ + local_88._M_string_length)) {
    uVar12 = (char *)0xf;
    if ((StringPiece *)local_88._M_dataplus._M_p != (StringPiece *)&local_88.field_2) {
      uVar12 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < (char *)(local_68.length_ + local_88._M_string_length)) goto LAB_002761fc;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68.ptr_);
  }
  else {
LAB_002761fc:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = puVar6[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_b0._M_string_length = puVar6[1];
  *puVar6 = psVar8;
  puVar6[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d0.field_2._M_allocated_capacity = *psVar8;
    local_d0.field_2._8_8_ = plVar7[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar8;
    local_d0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)out_error,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((StringPiece *)local_88._M_dataplus._M_p != (StringPiece *)&local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_90 = 0xffffffffffffffff;
  if ((char **)local_68.ptr_ != local_58) {
    operator_delete(local_68.ptr_);
  }
LAB_0027630f:
  return local_48 != local_90;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, std::string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        std::string("Framework/proto file mapping line without colon sign: '") +
        std::string(line) + "'.";
    return false;
  }
  StringPiece framework_name = line.substr(0, offset);
  StringPiece proto_file_list = line.substr(offset + 1);
  TrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file = proto_file_list.substr(start, offset - start);
    TrimWhitespace(&proto_file);
    if (!proto_file.empty()) {
      std::map<std::string, std::string>::iterator existing_entry =
          map_->find(std::string(proto_file));
      if (existing_entry != map_->end()) {
        std::cerr << "warning: duplicate proto file reference, replacing "
                     "framework entry for '"
                  << std::string(proto_file) << "' with '" << std::string(framework_name)
                  << "' (was '" << existing_entry->second << "')." << std::endl;
        std::cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        std::cerr << "note: framework mapping file had a proto file with a "
                     "space in, hopefully that isn't a missing comma: '"
                  << std::string(proto_file) << "'" << std::endl;
        std::cerr.flush();
      }

      (*map_)[std::string(proto_file)] = std::string(framework_name);
    }

    start = offset + 1;
  }

  return true;
}